

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O2

int CVmObjCharSet::is_rt_mappable(wchar_t c,CCharmapToLocal *to_local,CCharmapToUni *to_uni)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  undefined4 extraout_var;
  size_t sVar4;
  uint uVar5;
  size_t lcllen;
  char unibuf [16];
  char *p;
  size_t unilen;
  char lclbuf [16];
  
  iVar1 = (*(to_local->super_CCharmap)._vptr_CCharmap[6])(to_local,c);
  uVar5 = 0;
  if (iVar1 != 0) {
    pwVar3 = CCharmapToLocal::get_expansion(to_local,c,&lcllen);
    if (pwVar3 == (wchar_t *)0x0) {
      lcllen = CCharmapToLocal::map_char(to_local,c,lclbuf,0x10);
      p = unibuf;
      unilen = 0x10;
      iVar1 = (*(to_uni->super_CCharmap)._vptr_CCharmap[4])(to_uni,&p,&unilen,lclbuf,lcllen);
      unilen = CONCAT44(extraout_var,iVar1);
      sVar4 = 1;
      if (L'\x7f' < c) {
        sVar4 = 3 - (ulong)((uint)c < 0x800);
      }
      if (unilen == sVar4) {
        wVar2 = utf8_ptr::s_getch(unibuf);
        uVar5 = (uint)(wVar2 == c);
      }
    }
  }
  return uVar5;
}

Assistant:

int CVmObjCharSet::is_rt_mappable(wchar_t c, CCharmapToLocal *to_local,
                                  CCharmapToUni *to_uni)
{
    char lclbuf[16];
    char unibuf[16];
    size_t lcllen;
    size_t unilen;
    char *p;

    /* if there's no local mapping, it's obviously not mappable */
    if (!to_local->is_mappable(c))
        return FALSE;

    /* 
     *   If there's an expansion in the mapping to the local set, then there
     *   can't be a round-trip mapping.  Expansions are inherently one-way
     *   because they produce multiple local characters for a single unicode
     *   character, and the reverse mapping has no way to group those
     *   multiple local characters back into a single unicode character.  
     */
    if (to_local->get_expansion(c, &lcllen) != 0)
        return FALSE;

    /* get the local mapping */
    lcllen = to_local->map_char(c, lclbuf, sizeof(lclbuf));

    /* map it back to unicode */
    p = unibuf;
    unilen = sizeof(unibuf);
    unilen = to_uni->map(&p, &unilen, lclbuf, lcllen);

    /* 
     *   if the unicode mapping is one character that exactly matches the
     *   original input character, then we have a valid round-trip mapping 
     */
    return (unilen == utf8_ptr::s_wchar_size(c)
            && utf8_ptr::s_getch(unibuf) == c);
}